

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_facelift.c
# Opt level: O0

REF_STATUS ref_facelift_infer_displacement(REF_FACELIFT ref_facelift)

{
  int iVar1;
  REF_GEOM ref_geom_00;
  REF_NODE pRVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT node;
  REF_INT geom;
  REF_INT i;
  REF_DBL geom_xyz [3];
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_FACELIFT ref_facelift_local;
  
  ref_geom_00 = ref_facelift->grid->geom;
  pRVar2 = ref_facelift->grid->node;
  if (ref_facelift->displacement == (REF_DBL *)0x0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c",
           0x1c7,"ref_facelift_infer_displacement","requires indirect facelift");
    ref_facelift_local._4_4_ = 1;
  }
  else {
    for (ref_private_macro_code_rss = 0; ref_private_macro_code_rss < ref_geom_00->max;
        ref_private_macro_code_rss = ref_private_macro_code_rss + 1) {
      if (ref_geom_00->descr[ref_private_macro_code_rss * 6] != -1) {
        uVar3 = ref_egads_eval(ref_geom_00,ref_private_macro_code_rss,(REF_DBL *)&geom,
                               (REF_DBL *)0x0);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_facelift.c"
                 ,0x1ca,"ref_facelift_infer_displacement",(ulong)uVar3,"eval geom");
          return uVar3;
        }
        iVar1 = ref_geom_00->descr[ref_private_macro_code_rss * 6 + 5];
        for (node = 0; node < 3; node = node + 1) {
          ref_facelift->displacement[node + ref_private_macro_code_rss * 3] =
               pRVar2->real[node + iVar1 * 0xf] - *(double *)(&geom + (long)node * 2);
        }
      }
    }
    ref_facelift_local._4_4_ = 0;
  }
  return ref_facelift_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_facelift_infer_displacement(
    REF_FACELIFT ref_facelift) {
  REF_GEOM ref_geom = ref_facelift_geom(ref_facelift);
  REF_NODE ref_node = ref_grid_node(ref_facelift_grid(ref_facelift));
  REF_DBL geom_xyz[3];
  REF_INT i, geom, node;

  RAS(!ref_facelift_direct(ref_facelift), "requires indirect facelift");

  each_ref_geom(ref_geom, geom) {
    RSS(ref_egads_eval(ref_geom, geom, geom_xyz, NULL), "eval geom");
    node = ref_geom_node(ref_geom, geom);
    for (i = 0; i < 3; i++) {
      ref_facelift_displacement(ref_facelift, i, geom) =
          ref_node_xyz(ref_node, i, node) - geom_xyz[i];
    }
  }

  return REF_SUCCESS;
}